

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::TestFSChaCha20
          (CryptoTest *this,string *hex_plaintext,string *hexkey,uint32_t rekey_interval,
          string *ciphertext_after_rotation)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ChaCha20 *pCVar4;
  ChaCha20 *pCVar5;
  string *psVar6;
  iterator pvVar7;
  iterator in_R9;
  uint *puVar8;
  iterator pvVar9;
  long in_FS_OFFSET;
  bool bVar10;
  byte bVar11;
  string_view hex_str;
  const_string file;
  string_view hex_str_00;
  Span<const_std::byte> key_00;
  Span<const_std::byte> key_01;
  Span<const_std::byte> input;
  Span<const_std::byte> input_00;
  const_string file_00;
  Span<const_std::byte> input_01;
  const_string file_01;
  Span<std::byte> out;
  Span<const_std::byte> key_02;
  Span<const_std::byte> input_02;
  const_string file_02;
  const_string file_03;
  Span<const_unsigned_char> s;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  Span<std::byte> output;
  Span<std::byte> output_00;
  Span<std::byte> output_01;
  Span<std::byte> output_02;
  ChaCha20 *pCVar12;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  assertion_result local_338;
  char **local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  vector<std::byte,_std::allocator<std::byte>_> c20_output;
  vector<std::byte,_std::allocator<std::byte>_> fsc20_output;
  vector<std::byte,_std::allocator<std::byte>_> plaintext;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  vector<std::byte,_std::allocator<std::byte>_> key;
  string local_1f8;
  byte new_key [32];
  ChaCha20 c20_copy;
  ChaCha20 c20;
  FSChaCha20 fsc20;
  
  bVar11 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (hexkey->_M_dataplus)._M_p;
  hex_str._M_len = hexkey->_M_string_length;
  psVar6 = ciphertext_after_rotation;
  ParseHex<std::byte>(&key,hex_str);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xc0;
  file.m_begin = (iterator)&local_220;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)psVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_230,msg);
  fsc20.m_chacha20.m_aligned.input[2]._0_1_ = 0;
  fsc20.m_chacha20.m_aligned.input._0_8_ = &PTR__lazy_ostream_011480b0;
  fsc20.m_chacha20.m_aligned.input._16_8_ = boost::unit_test::lazy_ostream::inst;
  fsc20.m_chacha20.m_aligned.input._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_238 = "";
  c20.m_aligned.input._0_8_ =
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  pCVar12 = &c20;
  puVar8 = &FSChaCha20::KEYLEN;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_long>
            (&fsc20,&local_240,0xc0,1,2,&FSChaCha20::KEYLEN,"FSChaCha20::KEYLEN",pCVar12,
             "key.size()");
  hex_str_00._M_str = (hex_plaintext->_M_dataplus)._M_p;
  hex_str_00._M_len = hex_plaintext->_M_string_length;
  ParseHex<std::byte>(&plaintext,hex_str_00);
  key_00.m_size =
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  key_00.m_data =
       key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
       ._M_start;
  FSChaCha20::FSChaCha20(&fsc20,key_00,rekey_interval);
  key_01.m_size =
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  key_01.m_data =
       key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
       ._M_start;
  ChaCha20::ChaCha20(&c20,key_01);
  fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::byte,_std::allocator<std::byte>_>::resize
            (&fsc20_output,
             (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start);
  c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::byte,_std::allocator<std::byte>_>::resize
            (&c20_output,
             (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start);
  uVar3 = (ulong)rekey_interval;
  while( true ) {
    input.m_size = (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_start;
    output.m_size =
         (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    input.m_data = plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
    output.m_data =
         fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    FSChaCha20::Crypt(&fsc20,input,output);
    bVar10 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar10) break;
    input_00.m_size =
         (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    output_00.m_size =
         c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
    input_00.m_data =
         plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    output_00.m_data =
         c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    ChaCha20::Crypt(&c20,input_00,output_00);
    local_2a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_2a0 = "";
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xd0;
    file_00.m_begin = (iterator)&local_2a8;
    msg_00.m_end = (iterator)puVar8;
    msg_00.m_begin = (iterator)output_00.m_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2b8,
               msg_00);
    bVar10 = std::operator==(&c20_output,&fsc20_output);
    new_key[0] = bVar10;
    new_key[8] = 0;
    new_key[9] = 0;
    new_key[10] = 0;
    new_key[0xb] = 0;
    new_key[0xc] = 0;
    new_key[0xd] = 0;
    new_key[0xe] = 0;
    new_key[0xf] = 0;
    new_key[0x10] = 0;
    new_key[0x11] = 0;
    new_key[0x12] = 0;
    new_key[0x13] = 0;
    new_key[0x14] = 0;
    new_key[0x15] = 0;
    new_key[0x16] = 0;
    new_key[0x17] = 0;
    local_338._0_8_ = "c20_output == fsc20_output";
    local_338.m_message.px = (element_type *)0xb905aa;
    c20_copy.m_aligned.input[2]._0_1_ = 0;
    c20_copy.m_aligned.input._0_8_ = &PTR__lazy_ostream_011481f0;
    c20_copy.m_aligned.input._16_8_ = boost::unit_test::lazy_ostream::inst;
    c20_copy.m_aligned.input._24_8_ = &local_338;
    local_2c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_2c0 = "";
    puVar8 = (uint *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)new_key,(lazy_ostream *)&c20_copy,1,0,WARN,(check_type)pCVar12,
               (size_t)&local_2c8,0xd0);
    boost::detail::shared_count::~shared_count((shared_count *)(new_key + 0x10));
  }
  pCVar4 = &c20;
  pCVar5 = &c20_copy;
  for (lVar2 = 0x1d; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pCVar5->m_aligned).input[0] = (pCVar4->m_aligned).input[0];
    pCVar4 = (ChaCha20 *)((long)pCVar4 + (ulong)bVar11 * -8 + 4);
    pCVar5 = (ChaCha20 *)((long)pCVar5 + (ulong)bVar11 * -8 + 4);
  }
  input_01.m_size =
       (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  output_01.m_size =
       c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start;
  input_01.m_data =
       plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  output_01.m_data =
       c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  ChaCha20::Crypt(&c20,input_01,output_01);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xd7;
  file_01.m_begin = (iterator)&local_2d8;
  msg_01.m_end = (iterator)puVar8;
  msg_01.m_begin = (iterator)output_01.m_size;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2e8,
             msg_01);
  bVar10 = std::operator==(&c20_output,&fsc20_output);
  local_338.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar10;
  local_338.m_message.px = (element_type *)0x0;
  local_338.m_message.pn.pi_ = (sp_counted_base *)0x0;
  new_key._24_8_ = &local_1f8;
  local_1f8._M_dataplus._M_p = "c20_output != fsc20_output";
  local_1f8._M_string_length = 0xb905c5;
  new_key._8_8_ = new_key._8_8_ & 0xffffffffffffff00;
  new_key._0_8_ = &PTR__lazy_ostream_011481f0;
  new_key._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_2f0 = "";
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_338,(lazy_ostream *)new_key,1,0,WARN,(check_type)pCVar12,(size_t)&local_2f8,0xd7
            );
  boost::detail::shared_count::~shared_count(&local_338.m_message.pn);
  out.m_size = 0x20;
  out.m_data = new_key;
  ChaCha20::Keystream(&c20_copy,out);
  key_02.m_size = 0x20;
  key_02.m_data = new_key;
  ChaCha20::SetKey(&c20,key_02);
  ChaCha20::Seek(&c20,(Nonce96)(ZEXT816(1) << 0x40),0);
  input_02.m_size =
       (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  output_02.m_size =
       c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start;
  input_02.m_data =
       plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  output_02.m_data =
       c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  ChaCha20::Crypt(&c20,input_02,output_02);
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xe0;
  file_02.m_begin = (iterator)&local_308;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = (iterator)output_02.m_size;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_318,
             msg_02);
  bVar10 = std::operator==(&c20_output,&fsc20_output);
  local_1f8._M_dataplus._M_p._0_1_ = bVar10;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_allocated_capacity = 0;
  local_320 = &local_348;
  local_348 = "c20_output == fsc20_output";
  local_340 = "";
  local_338.m_message.px = (element_type *)((ulong)local_338.m_message.px & 0xffffffffffffff00);
  local_338._0_8_ = &PTR__lazy_ostream_011481f0;
  local_338.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_350 = "";
  pvVar7 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1f8,(lazy_ostream *)&local_338,1,0,WARN,(check_type)pCVar12,
             (size_t)&local_358,0xe0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1f8.field_2._M_allocated_capacity);
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_360 = "";
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xe2;
  file_03.m_begin = (iterator)&local_368;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_378,
             msg_03);
  local_338.m_message.px = (element_type *)((ulong)local_338.m_message.px & 0xffffffffffffff00);
  local_338._0_8_ = &PTR__lazy_ostream_011480b0;
  local_338.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_320 = (char **)0xc7f1cc;
  local_388 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_380 = "";
  s.m_size = (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  s.m_data = fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_1f8,s);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_338,&local_388,0xe2,1,2,&local_1f8,"HexStr(fsc20_output)",
             ciphertext_after_rotation,"ciphertext_after_rotation");
  std::__cxx11::string::~string((string *)&local_1f8);
  ChaCha20::~ChaCha20(&c20_copy);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&c20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&fsc20_output.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  ChaCha20::~ChaCha20(&c20);
  ChaCha20::~ChaCha20(&fsc20.m_chacha20);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&plaintext.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestFSChaCha20(const std::string& hex_plaintext, const std::string& hexkey, uint32_t rekey_interval, const std::string& ciphertext_after_rotation)
{
    auto key = ParseHex<std::byte>(hexkey);
    BOOST_CHECK_EQUAL(FSChaCha20::KEYLEN, key.size());

    auto plaintext = ParseHex<std::byte>(hex_plaintext);

    auto fsc20 = FSChaCha20{key, rekey_interval};
    auto c20 = ChaCha20{key};

    std::vector<std::byte> fsc20_output;
    fsc20_output.resize(plaintext.size());

    std::vector<std::byte> c20_output;
    c20_output.resize(plaintext.size());

    for (size_t i = 0; i < rekey_interval; i++) {
        fsc20.Crypt(plaintext, fsc20_output);
        c20.Crypt(plaintext, c20_output);
        BOOST_CHECK(c20_output == fsc20_output);
    }

    // At the rotation interval, the outputs will no longer match
    fsc20.Crypt(plaintext, fsc20_output);
    auto c20_copy = c20;
    c20.Crypt(plaintext, c20_output);
    BOOST_CHECK(c20_output != fsc20_output);

    std::byte new_key[FSChaCha20::KEYLEN];
    c20_copy.Keystream(new_key);
    c20.SetKey(new_key);
    c20.Seek({0, 1}, 0);

    // Outputs should match again after simulating key rotation
    c20.Crypt(plaintext, c20_output);
    BOOST_CHECK(c20_output == fsc20_output);

    BOOST_CHECK_EQUAL(HexStr(fsc20_output), ciphertext_after_rotation);
}